

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_set_gej_var(secp256k1_ge *r,secp256k1_gej *a)

{
  secp256k1_fe *r_00;
  secp256k1_fe *r_01;
  int iVar1;
  secp256k1_fe z3;
  secp256k1_fe z2;
  
  secp256k1_gej_verify(a);
  iVar1 = secp256k1_gej_is_infinity(a);
  if (iVar1 != 0) {
    secp256k1_ge_set_infinity(r);
    return;
  }
  r->infinity = 0;
  r_00 = &a->z;
  secp256k1_fe_inv_var(r_00,r_00);
  secp256k1_fe_sqr(&z2,r_00);
  secp256k1_fe_mul(&z3,r_00,&z2);
  secp256k1_fe_mul(&a->x,&a->x,&z2);
  r_01 = &a->y;
  secp256k1_fe_mul(r_01,r_01,&z3);
  secp256k1_fe_set_int(r_00,1);
  secp256k1_ge_set_xy(r,&a->x,r_01);
  secp256k1_gej_verify(a);
  secp256k1_ge_verify(r);
  return;
}

Assistant:

static void secp256k1_ge_set_gej_var(secp256k1_ge *r, secp256k1_gej *a) {
    secp256k1_fe z2, z3;
    SECP256K1_GEJ_VERIFY(a);

    if (secp256k1_gej_is_infinity(a)) {
        secp256k1_ge_set_infinity(r);
        return;
    }
    r->infinity = 0;
    secp256k1_fe_inv_var(&a->z, &a->z);
    secp256k1_fe_sqr(&z2, &a->z);
    secp256k1_fe_mul(&z3, &a->z, &z2);
    secp256k1_fe_mul(&a->x, &a->x, &z2);
    secp256k1_fe_mul(&a->y, &a->y, &z3);
    secp256k1_fe_set_int(&a->z, 1);
    secp256k1_ge_set_xy(r, &a->x, &a->y);

    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(r);
}